

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_fir_filter.cc
# Opt level: O3

void __thiscall
webrtc::SparseFIRFilter::SparseFIRFilter
          (SparseFIRFilter *this,float *nonzero_coeffs,size_t num_nonzero_coeffs,size_t sparsity,
          size_t offset)

{
  string *psVar1;
  allocator_type local_1b9;
  size_t local_1b8;
  size_t local_1b0;
  FatalMessage local_1a8;
  
  this->sparsity_ = sparsity;
  this->offset_ = offset;
  local_1b8 = sparsity;
  local_1b0 = num_nonzero_coeffs;
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)&this->nonzero_coeffs_,nonzero_coeffs,
             nonzero_coeffs + num_nonzero_coeffs,(allocator_type *)&local_1a8);
  local_1a8.stream_ = (ostringstream)0x0;
  local_1a8._1_3_ = 0;
  std::vector<float,_std::allocator<float>_>::vector
            (&this->state_,(num_nonzero_coeffs - 1) * this->sparsity_ + this->offset_,
             (value_type_conflict *)&local_1a8,&local_1b9);
  local_1a8.stream_ = (ostringstream)0x1;
  local_1a8._1_3_ = 0;
  if (num_nonzero_coeffs == 0) {
    psVar1 = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       (&local_1b0,(uint *)&local_1a8,"num_nonzero_coeffs >= 1u");
    if (psVar1 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/sparse_fir_filter.cc"
                 ,0x19,psVar1);
      goto LAB_0014bf68;
    }
  }
  local_1a8.stream_ = (ostringstream)0x1;
  local_1a8._1_3_ = 0;
  if (sparsity == 0) {
    psVar1 = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       (&local_1b8,(uint *)&local_1a8,"sparsity >= 1u");
    if (psVar1 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/sparse_fir_filter.cc"
                 ,0x1a,psVar1);
LAB_0014bf68:
      rtc::FatalMessage::~FatalMessage(&local_1a8);
    }
  }
  return;
}

Assistant:

SparseFIRFilter::SparseFIRFilter(const float* nonzero_coeffs,
                                 size_t num_nonzero_coeffs,
                                 size_t sparsity,
                                 size_t offset)
    : sparsity_(sparsity),
      offset_(offset),
      nonzero_coeffs_(nonzero_coeffs, nonzero_coeffs + num_nonzero_coeffs),
      state_(sparsity_ * (num_nonzero_coeffs - 1) + offset_, 0.f) {
  RTC_CHECK_GE(num_nonzero_coeffs, 1u);
  RTC_CHECK_GE(sparsity, 1u);
}